

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix2 * matrix2_inverse(matrix2 *self,matrix2 *mR)

{
  long lVar1;
  double dVar2;
  double dVar3;
  matrix2 inverse;
  
  dVar2 = (self->field_0).m[0] * (self->field_0).m[3] - (self->field_0).m[1] * (self->field_0).m[2];
  dVar3 = -dVar2;
  if (-dVar2 <= dVar2) {
    dVar3 = dVar2;
  }
  if (dVar3 < 1e-05) {
    mR = (matrix2 *)0x0;
  }
  else {
    inverse.field_0.m[0] = (self->field_0).m[3];
    inverse.field_0.m[2] = -(self->field_0).m[2];
    inverse.field_0.m[1] = -(self->field_0).m[1];
    inverse.field_0.m[3] = (self->field_0).m[0];
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      (mR->field_0).m[lVar1] = inverse.field_0.m[lVar1] * (1.0 / dVar2);
    }
  }
  return mR;
}

Assistant:

HYPAPI struct matrix2 *matrix2_inverse(const struct matrix2 *self, struct matrix2 *mR)
{
	struct matrix2 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix2_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	/* find the adjugate of self */
	inverse.c00 = self->c11;
	inverse.c01 = -self->c01;
	inverse.c10 = -self->c10;
	inverse.c11 = self->c00;

	/* divide the determinant */
	for (i = 0; i < 4; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}